

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void initCSharpData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QMultiHash<char,_QLatin1String> QStack_7c8;
  pair<char,_QLatin1String> local_7b8;
  undefined1 local_7a0;
  undefined8 local_798;
  char *local_790;
  undefined1 local_788;
  undefined8 local_780;
  char *local_778;
  undefined1 local_770;
  undefined8 local_768;
  char *local_760;
  undefined1 local_758;
  undefined8 local_750;
  char *local_748;
  undefined1 local_740;
  undefined8 local_738;
  char *local_730;
  undefined1 local_728;
  undefined8 local_720;
  char *local_718;
  undefined1 local_710;
  undefined8 local_708;
  char *local_700;
  undefined1 local_6f8;
  undefined8 local_6f0;
  char *local_6e8;
  undefined1 local_6e0;
  undefined8 local_6d8;
  char *local_6d0;
  undefined1 local_6c8;
  undefined8 local_6c0;
  char *local_6b8;
  undefined1 local_6b0;
  undefined8 local_6a8;
  char *local_6a0;
  undefined1 local_698;
  undefined8 local_690;
  char *local_688;
  undefined1 local_680;
  undefined8 local_678;
  char *local_670;
  undefined1 local_668;
  undefined8 local_660;
  char *local_658;
  undefined1 local_650;
  undefined8 local_648;
  char *local_640;
  undefined1 local_638;
  undefined8 local_630;
  char *local_628;
  undefined1 local_620;
  undefined8 local_618;
  char *local_610;
  undefined1 local_608;
  undefined8 local_600;
  char *local_5f8;
  undefined1 local_5f0;
  undefined8 local_5e8;
  char *local_5e0;
  undefined1 local_5d8;
  undefined8 local_5d0;
  char *local_5c8;
  undefined1 local_5c0;
  undefined8 local_5b8;
  char *local_5b0;
  undefined1 local_5a8;
  undefined8 local_5a0;
  char *local_598;
  undefined1 local_590;
  undefined8 local_588;
  char *local_580;
  undefined1 local_578;
  undefined8 local_570;
  char *local_568;
  undefined1 local_560;
  undefined8 local_558;
  char *local_550;
  undefined1 local_548;
  undefined8 local_540;
  char *local_538;
  undefined1 local_530;
  undefined8 local_528;
  char *local_520;
  undefined1 local_518;
  undefined8 local_510;
  char *local_508;
  undefined1 local_500;
  undefined8 local_4f8;
  char *local_4f0;
  undefined1 local_4e8;
  undefined8 local_4e0;
  char *local_4d8;
  undefined1 local_4d0;
  undefined8 local_4c8;
  char *local_4c0;
  undefined1 local_4b8;
  undefined8 local_4b0;
  char *local_4a8;
  undefined1 local_4a0;
  undefined8 local_498;
  char *local_490;
  undefined1 local_488;
  undefined8 local_480;
  char *local_478;
  undefined1 local_470;
  undefined8 local_468;
  char *local_460;
  undefined1 local_458;
  undefined8 local_450;
  char *local_448;
  undefined1 local_440;
  undefined8 local_438;
  char *local_430;
  undefined1 local_428;
  undefined8 local_420;
  char *local_418;
  undefined1 local_410;
  undefined8 local_408;
  char *local_400;
  undefined1 local_3f8;
  undefined8 local_3f0;
  char *local_3e8;
  undefined1 local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  undefined1 local_3c8;
  undefined8 local_3c0;
  char *local_3b8;
  undefined1 local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined1 local_398;
  undefined8 local_390;
  char *local_388;
  undefined1 local_380;
  undefined8 local_378;
  char *local_370;
  undefined1 local_368;
  undefined8 local_360;
  char *local_358;
  undefined1 local_350;
  undefined8 local_348;
  char *local_340;
  undefined1 local_338;
  undefined8 local_330;
  char *local_328;
  undefined1 local_320;
  undefined8 local_318;
  char *local_310;
  undefined1 local_308;
  undefined8 local_300;
  char *local_2f8;
  undefined1 local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  undefined1 local_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  undefined1 local_2c0;
  undefined8 local_2b8;
  char *local_2b0;
  undefined1 local_2a8;
  undefined8 local_2a0;
  char *local_298;
  undefined1 local_290;
  undefined8 local_288;
  char *local_280;
  undefined1 local_278;
  undefined8 local_270;
  char *local_268;
  undefined1 local_260;
  undefined8 local_258;
  char *local_250;
  undefined1 local_248;
  undefined8 local_240;
  char *local_238;
  undefined1 local_230;
  undefined8 local_228;
  char *local_220;
  undefined1 local_218;
  undefined8 local_210;
  char *local_208;
  undefined1 local_200;
  undefined8 local_1f8;
  char *local_1f0;
  undefined1 local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined1 local_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  undefined1 local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined1 local_1a0;
  undefined8 local_198;
  char *local_190;
  undefined1 local_188;
  undefined8 local_180;
  char *local_178;
  undefined1 local_170;
  undefined8 local_168;
  char *local_160;
  undefined1 local_158;
  undefined8 local_150;
  char *local_148;
  undefined1 local_140;
  undefined8 local_138;
  char *local_130;
  undefined1 local_128;
  undefined8 local_120;
  char *local_118;
  undefined1 local_110;
  undefined8 local_108;
  char *local_100;
  undefined1 local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined1 local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined1 local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined1 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined1 local_98;
  undefined8 local_90;
  char *local_88;
  undefined1 local_80;
  undefined8 local_78;
  char *local_70;
  undefined1 local_68;
  undefined8 local_60;
  char *local_58;
  undefined1 local_50;
  undefined8 local_48;
  char *local_40;
  
  local_7b8.first = 'a';
  local_7b8.second.m_size = 8;
  local_7b8.second.m_data = "abstract";
  local_7a0 = 0x61;
  local_798 = 3;
  local_790 = "add";
  local_788 = 0x61;
  local_780 = 5;
  local_778 = "alias";
  local_770 = 0x61;
  local_768 = 2;
  local_760 = "as";
  local_758 = 0x61;
  local_750 = 9;
  local_748 = "ascending";
  local_740 = 0x61;
  local_738 = 5;
  local_730 = "async";
  local_728 = 0x61;
  local_720 = 5;
  local_718 = "await";
  local_710 = 0x62;
  local_708 = 4;
  local_700 = "base";
  local_6f8 = 0x62;
  local_6f0 = 5;
  local_6e8 = "break";
  local_6e0 = 99;
  local_6d8 = 4;
  local_6d0 = "case";
  local_6c8 = 99;
  local_6c0 = 5;
  local_6b8 = "catch";
  local_6b0 = 99;
  local_6a8 = 7;
  local_6a0 = "checked";
  local_698 = 99;
  local_690 = 5;
  local_688 = "const";
  local_680 = 99;
  local_678 = 8;
  local_670 = "continue";
  local_668 = 100;
  local_660 = 7;
  local_658 = "decimal";
  local_650 = 100;
  local_648 = 7;
  local_640 = "default";
  local_638 = 100;
  local_630 = 8;
  local_628 = "delegate";
  local_620 = 100;
  local_618 = 10;
  local_610 = "descending";
  local_608 = 100;
  local_600 = 2;
  local_5f8 = "do";
  local_5f0 = 100;
  local_5e8 = 7;
  local_5e0 = "dynamic";
  local_5d8 = 0x65;
  local_5d0 = 4;
  local_5c8 = "else";
  local_5c0 = 0x65;
  local_5b8 = 5;
  local_5b0 = "event";
  local_5a8 = 0x65;
  local_5a0 = 8;
  local_598 = "explicit";
  local_590 = 0x65;
  local_588 = 6;
  local_580 = "extern";
  local_578 = 0x66;
  local_570 = 7;
  local_568 = "finally";
  local_560 = 0x66;
  local_558 = 5;
  local_550 = "fixed";
  local_548 = 0x66;
  local_540 = 3;
  local_538 = "for";
  local_530 = 0x66;
  local_528 = 7;
  local_520 = "foreach";
  local_518 = 0x66;
  local_510 = 4;
  local_508 = "from";
  local_500 = 0x67;
  local_4f8 = 3;
  local_4f0 = "get";
  local_4e8 = 0x67;
  local_4e0 = 6;
  local_4d8 = "global";
  local_4d0 = 0x67;
  local_4c8 = 4;
  local_4c0 = "goto";
  local_4b8 = 0x67;
  local_4b0 = 5;
  local_4a8 = "group";
  local_4a0 = 0x69;
  local_498 = 2;
  local_490 = "if";
  local_488 = 0x69;
  local_480 = 8;
  local_478 = "implicit";
  local_470 = 0x69;
  local_468 = 2;
  local_460 = "in";
  local_458 = 0x69;
  local_450 = 9;
  local_448 = "interface";
  local_440 = 0x69;
  local_438 = 8;
  local_430 = "internal";
  local_428 = 0x69;
  local_420 = 4;
  local_418 = "into";
  local_410 = 0x69;
  local_408 = 2;
  local_400 = "is";
  local_3f8 = 0x6a;
  local_3f0 = 4;
  local_3e8 = "join";
  local_3e0 = 0x6c;
  local_3d8 = 3;
  local_3d0 = "let";
  local_3c8 = 0x6c;
  local_3c0 = 4;
  local_3b8 = "lock";
  local_3b0 = 0x6c;
  local_3a8 = 4;
  local_3a0 = "long";
  local_398 = 0x6e;
  local_390 = 9;
  local_388 = "namespace";
  local_380 = 0x6e;
  local_378 = 3;
  local_370 = "new";
  local_368 = 0x6f;
  local_360 = 6;
  local_358 = "object";
  local_350 = 0x6f;
  local_348 = 8;
  local_340 = "operator";
  local_338 = 0x6f;
  local_330 = 7;
  local_328 = "orderby";
  local_320 = 0x6f;
  local_318 = 3;
  local_310 = "out";
  local_308 = 0x6f;
  local_300 = 8;
  local_2f8 = "override";
  local_2f0 = 0x70;
  local_2e8 = 6;
  local_2e0 = "params";
  local_2d8 = 0x70;
  local_2d0 = 7;
  local_2c8 = "partial";
  local_2c0 = 0x70;
  local_2b8 = 7;
  local_2b0 = "private";
  local_2a8 = 0x70;
  local_2a0 = 9;
  local_298 = "protected";
  local_290 = 0x70;
  local_288 = 6;
  local_280 = "public";
  local_278 = 0x72;
  local_270 = 8;
  local_268 = "readonly";
  local_260 = 0x72;
  local_258 = 3;
  local_250 = "ref";
  local_248 = 0x72;
  local_240 = 6;
  local_238 = "remove";
  local_230 = 0x72;
  local_228 = 6;
  local_220 = "return";
  local_218 = 0x73;
  local_210 = 6;
  local_208 = "sealed";
  local_200 = 0x73;
  local_1f8 = 6;
  local_1f0 = "select";
  local_1e8 = 0x73;
  local_1e0 = 3;
  local_1d8 = "set";
  local_1d0 = 0x73;
  local_1c8 = 6;
  local_1c0 = "sizeof";
  local_1b8 = 0x73;
  local_1b0 = 10;
  local_1a8 = "stackalloc";
  local_1a0 = 0x73;
  local_198 = 6;
  local_190 = "static";
  local_188 = 0x73;
  local_180 = 6;
  local_178 = "switch";
  local_170 = 0x74;
  local_168 = 4;
  local_160 = "this";
  local_158 = 0x74;
  local_150 = 5;
  local_148 = "throw";
  local_140 = 0x74;
  local_138 = 3;
  local_130 = "try";
  local_128 = 0x74;
  local_120 = 6;
  local_118 = "typeof";
  local_110 = 0x75;
  local_108 = 9;
  local_100 = "unchecked";
  local_f8 = 0x75;
  local_f0 = 6;
  local_e8 = "unsafe";
  local_e0 = 0x75;
  local_d8 = 5;
  local_d0 = "using";
  local_c8 = 0x76;
  local_c0 = 5;
  local_b8 = "value";
  local_b0 = 0x76;
  local_a8 = 7;
  local_a0 = "virtual";
  local_98 = 0x76;
  local_90 = 8;
  local_88 = "volatile";
  local_80 = 0x77;
  local_78 = 5;
  local_70 = "where";
  local_68 = 0x77;
  local_60 = 5;
  local_58 = "while";
  local_50 = 0x79;
  local_48 = 5;
  local_40 = "yield";
  list._M_len = 0x50;
  list._M_array = &local_7b8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_7c8,list);
  QMultiHash<char,_QLatin1String>::operator=(&csharp_keywords,&QStack_7c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_7c8);
  local_7b8.first = 'b';
  local_7b8.second.m_size = 4;
  local_7b8.second.m_data = "bool";
  local_7a0 = 0x62;
  local_798 = 4;
  local_790 = "byte";
  local_788 = 99;
  local_780 = 4;
  local_778 = "char";
  local_770 = 99;
  local_768 = 5;
  local_760 = "class";
  local_758 = 100;
  local_750 = 6;
  local_748 = "double";
  local_740 = 0x65;
  local_738 = 4;
  local_730 = "enum";
  local_728 = 0x66;
  local_720 = 5;
  local_718 = "float";
  local_710 = 0x69;
  local_708 = 3;
  local_700 = "int";
  local_6f8 = 0x73;
  local_6f0 = 5;
  local_6e8 = "sbyte";
  local_6e0 = 0x73;
  local_6d8 = 5;
  local_6d0 = "short";
  local_6c8 = 0x73;
  local_6c0 = 6;
  local_6b8 = "string";
  local_6b0 = 0x73;
  local_6a8 = 6;
  local_6a0 = "struct";
  local_698 = 0x75;
  local_690 = 4;
  local_688 = "uint";
  local_680 = 0x75;
  local_678 = 5;
  local_670 = "ulong";
  local_668 = 0x75;
  local_660 = 6;
  local_658 = "ushort";
  local_650 = 0x76;
  local_648 = 3;
  local_640 = "var";
  local_638 = 0x76;
  local_630 = 4;
  local_628 = "void";
  list_00._M_len = 0x11;
  list_00._M_array = &local_7b8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_7c8,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&csharp_types,&QStack_7c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_7c8);
  local_7b8.first = 'f';
  local_7b8.second.m_size = 5;
  local_7b8.second.m_data = "false";
  local_7a0 = 0x74;
  local_798 = 4;
  local_790 = "true";
  local_788 = 0x6e;
  local_780 = 4;
  local_778 = "null";
  list_01._M_len = 3;
  list_01._M_array = &local_7b8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_7c8,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&csharp_literals,&QStack_7c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_7c8);
  local_7b8.first = '\0';
  local_7b8._1_7_ = 0;
  local_7b8.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&csharp_builtin,(QMultiHash<char,_QLatin1String> *)&local_7b8);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7b8);
  local_7b8.first = 'd';
  local_7b8.second.m_size = 6;
  local_7b8.second.m_data = "define";
  local_7a0 = 0x65;
  local_798 = 4;
  local_790 = "elif";
  local_788 = 0x65;
  local_780 = 4;
  local_778 = "else";
  local_770 = 0x65;
  local_768 = 5;
  local_760 = "endif";
  local_758 = 0x65;
  local_750 = 9;
  local_748 = "endregion";
  local_740 = 0x65;
  local_738 = 5;
  local_730 = "error";
  local_728 = 0x69;
  local_720 = 2;
  local_718 = "if";
  local_710 = 0x6c;
  local_708 = 4;
  local_700 = "line";
  local_6f8 = 0x70;
  local_6f0 = 6;
  local_6e8 = "pragma";
  local_6e0 = 0x72;
  local_6d8 = 6;
  local_6d0 = "region";
  local_6c8 = 0x75;
  local_6c0 = 5;
  local_6b8 = "undef";
  local_6b0 = 0x77;
  local_6a8 = 7;
  local_6a0 = "warning";
  list_02._M_len = 0xc;
  list_02._M_array = &local_7b8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_7c8,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&csharp_other,&QStack_7c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_7c8);
  return;
}

Assistant:

void initCSharpData() {
    csharp_keywords = {{('a'), QLatin1String("abstract")},
                       {('a'), QLatin1String("add")},
                       {('a'), QLatin1String("alias")},
                       {('a'), QLatin1String("as")},
                       {('a'), QLatin1String("ascending")},
                       {('a'), QLatin1String("async")},
                       {('a'), QLatin1String("await")},
                       {('b'), QLatin1String("base")},
                       {('b'), QLatin1String("break")},
                       {('c'), QLatin1String("case")},
                       {('c'), QLatin1String("catch")},
                       {('c'), QLatin1String("checked")},
                       {('c'), QLatin1String("const")},
                       {('c'), QLatin1String("continue")},
                       {('d'), QLatin1String("decimal")},
                       {('d'), QLatin1String("default")},
                       {('d'), QLatin1String("delegate")},
                       {('d'), QLatin1String("descending")},
                       {('d'), QLatin1String("do")},
                       {('d'), QLatin1String("dynamic")},
                       {('e'), QLatin1String("else")},
                       {('e'), QLatin1String("event")},
                       {('e'), QLatin1String("explicit")},
                       {('e'), QLatin1String("extern")},
                       {('f'), QLatin1String("finally")},
                       {('f'), QLatin1String("fixed")},
                       {('f'), QLatin1String("for")},
                       {('f'), QLatin1String("foreach")},
                       {('f'), QLatin1String("from")},
                       {('g'), QLatin1String("get")},
                       {('g'), QLatin1String("global")},
                       {('g'), QLatin1String("goto")},
                       {('g'), QLatin1String("group")},
                       {('i'), QLatin1String("if")},
                       {('i'), QLatin1String("implicit")},
                       {('i'), QLatin1String("in")},
                       {('i'), QLatin1String("interface")},
                       {('i'), QLatin1String("internal")},
                       {('i'), QLatin1String("into")},
                       {('i'), QLatin1String("is")},
                       {('j'), QLatin1String("join")},
                       {('l'), QLatin1String("let")},
                       {('l'), QLatin1String("lock")},
                       {('l'), QLatin1String("long")},
                       {('n'), QLatin1String("namespace")},
                       {('n'), QLatin1String("new")},
                       {('o'), QLatin1String("object")},
                       {('o'), QLatin1String("operator")},
                       {('o'), QLatin1String("orderby")},
                       {('o'), QLatin1String("out")},
                       {('o'), QLatin1String("override")},
                       {('p'), QLatin1String("params")},
                       {('p'), QLatin1String("partial")},
                       {('p'), QLatin1String("private")},
                       {('p'), QLatin1String("protected")},
                       {('p'), QLatin1String("public")},
                       {('r'), QLatin1String("readonly")},
                       {('r'), QLatin1String("ref")},
                       {('r'), QLatin1String("remove")},
                       {('r'), QLatin1String("return")},
                       {('s'), QLatin1String("sealed")},
                       {('s'), QLatin1String("select")},
                       {('s'), QLatin1String("set")},
                       {('s'), QLatin1String("sizeof")},
                       {('s'), QLatin1String("stackalloc")},
                       {('s'), QLatin1String("static")},
                       {('s'), QLatin1String("switch")},
                       {('t'), QLatin1String("this")},
                       {('t'), QLatin1String("throw")},
                       {('t'), QLatin1String("try")},
                       {('t'), QLatin1String("typeof")},
                       {('u'), QLatin1String("unchecked")},
                       {('u'), QLatin1String("unsafe")},
                       {('u'), QLatin1String("using")},
                       {('v'), QLatin1String("value")},
                       {('v'), QLatin1String("virtual")},
                       {('v'), QLatin1String("volatile")},
                       {('w'), QLatin1String("where")},
                       {('w'), QLatin1String("while")},
                       {('y'), QLatin1String("yield")}};

    csharp_types = {
        {('b'), QLatin1String("bool")},   {('b'), QLatin1String("byte")},
        {('c'), QLatin1String("char")},   {('c'), QLatin1String("class")},
        {('d'), QLatin1String("double")}, {('e'), QLatin1String("enum")},
        {('f'), QLatin1String("float")},  {('i'), QLatin1String("int")},
        {('s'), QLatin1String("sbyte")},  {('s'), QLatin1String("short")},
        {('s'), QLatin1String("string")}, {('s'), QLatin1String("struct")},
        {('u'), QLatin1String("uint")},   {('u'), QLatin1String("ulong")},
        {('u'), QLatin1String("ushort")}, {('v'), QLatin1String("var")},
        {('v'), QLatin1String("void")},
    };

    csharp_literals = {{('f'), QLatin1String("false")},
                       {('t'), QLatin1String("true")},
                       {('n'), QLatin1String("null")}};

    csharp_builtin = {

    };

    csharp_other = {
        {('d'), QLatin1String("define")},    {('e'), QLatin1String("elif")},
        {('e'), QLatin1String("else")},      {('e'), QLatin1String("endif")},
        {('e'), QLatin1String("endregion")}, {('e'), QLatin1String("error")},
        {('i'), QLatin1String("if")},        {('l'), QLatin1String("line")},
        {('p'), QLatin1String("pragma")},    {('r'), QLatin1String("region")},
        {('u'), QLatin1String("undef")},     {('w'), QLatin1String("warning")}};
}